

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket.cpp
# Opt level: O3

int __thiscall sockpp::datagram_socket::open(datagram_socket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  int h;
  undefined1 auStack_48 [24];
  
  uVar1 = (**(code **)(*(long *)___oflag + 0x28))(___oflag);
  h = 0;
  iVar2 = ::socket((uint)uVar1,2,0);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    uVar3 = std::_V2::system_category();
    if (iVar2 == 0) goto LAB_00106efc;
    *(int *)(this + 8) = iVar2;
  }
  else {
    uVar3 = std::_V2::system_category();
    h = iVar2;
LAB_00106efc:
    socket::reset((socket *)__file,h);
    socket::bind((socket *)this,(int)__file,___oflag,0);
    if (*(int *)(this + 8) != 0) {
      (**(code **)(*(long *)__file + 0x28))(auStack_48,__file);
      goto LAB_00106f47;
    }
  }
  *(undefined8 *)(this + 0x10) = uVar3;
LAB_00106f47:
  return (int)this;
}

Assistant:

result<> datagram_socket::open(const sock_address& addr) noexcept {
    auto domain = addr.family();
    if (auto createRes = create_handle(domain); !createRes) {
        return createRes.error();
    }
    else {
        reset(createRes.value());
        if (auto res = bind(addr); !res) {
            close();
            return res;
        }
    }
    return none{};
}